

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCursorKey(unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
               void *pUserData)

{
  lhcell *pCell_00;
  int local_3c;
  int rc;
  lhcell *pCell;
  lhash_kv_cursor *pCur;
  void *pUserData_local;
  _func_int_void_ptr_uint_void_ptr *xConsumer_local;
  unqlite_kv_cursor *pCursor_local;
  
  if ((*(int *)&pCursor[1].pStore == 2) && (pCursor[2].pStore != (unqlite_kv_engine *)0x0)) {
    pCell_00 = (lhcell *)pCursor[2].pStore;
    if ((pCell_00->sKey).nByte == 0) {
      local_3c = lhConsumeCellkey(pCell_00,xConsumer,pUserData,0);
    }
    else {
      local_3c = (*xConsumer)((pCell_00->sKey).pBlob,(pCell_00->sKey).nByte,pUserData);
    }
    pCursor_local._4_4_ = local_3c;
  }
  else {
    pCursor_local._4_4_ = -9;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int lhCursorKey(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell */
	pCell = pCur->pCell;
	if( SyBlobLength(&pCell->sKey) > 0 ){
		/* Consume the key directly */
		rc = xConsumer(SyBlobData(&pCell->sKey),SyBlobLength(&pCell->sKey),pUserData);
	}else{
		/* Very large key */
		rc = lhConsumeCellkey(pCell,xConsumer,pUserData,0);
	}
	return rc;
}